

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GetStringField
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  long *local_b0;
  long local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[6])(&local_90,&this->namer_,field);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x36d9db);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar1[3];
    plVar5 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    plVar5 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)plVar5);
  if (plVar5 != &local_a0) {
    operator_delete(plVar5,local_a0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  TypeName_abi_cxx11_(&local_70,this,field);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x36c1bc);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_80 = *puVar4;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar4;
    local_90 = (ulong *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_a0 = *plVar1;
    lStack_98 = puVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar1;
    local_b0 = (long *)*puVar2;
  }
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)(puVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  OffsetPrefix_abi_cxx11_(&local_70,this,field);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_80 = *puVar4;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar4;
    local_90 = (ulong *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  GenGetter_abi_cxx11_(&local_50,this,&(field->value).type);
  uVar6 = 0xf;
  if (local_90 != &local_80) {
    uVar6 = local_80;
  }
  if (uVar6 < local_50._M_string_length + local_88) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar7 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_88 <= (ulong)uVar7) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
      goto LAB_0020caf1;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
LAB_0020caf1:
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_a0 = *plVar1;
    lStack_98 = puVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar1;
    local_b0 = (long *)*puVar2;
  }
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GetStringField(const StructDef &struct_def, const FieldDef &field,
                      std::string *code_ptr) {
    std::string &code = *code_ptr;
    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "() " + TypeName(field) + " ";
    code += OffsetPrefix(field) + "\t\treturn " + GenGetter(field.value.type);
    code += "(o + rcv._tab.Pos)\n\t}\n\treturn nil\n";
    code += "}\n\n";
  }